

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  byte *src_00;
  byte *pInLimit;
  U32 *pUVar1;
  uint uVar2;
  ldmEntry_t *plVar3;
  U64 UVar4;
  rawSeq *prVar5;
  ulong uVar6;
  BYTE *pBVar7;
  U32 UVar8;
  uint uVar9;
  U32 UVar10;
  U32 UVar11;
  U32 UVar12;
  ulong uVar13;
  byte *pbVar14;
  size_t sVar15;
  size_t sVar16;
  byte *iend;
  ulong uVar17;
  byte *lastHashed;
  byte *pbVar18;
  BYTE *pBase;
  ulong uVar19;
  U32 maxDist;
  long lVar20;
  long lVar21;
  U32 UVar22;
  uint uVar23;
  byte *pbVar24;
  BYTE *pBVar25;
  size_t sVar26;
  BYTE *pBase_00;
  ldmEntry_t *plVar27;
  uint local_1a0;
  U64 local_198;
  BYTE *local_180;
  int local_150;
  ulong local_148;
  size_t local_108;
  ldmEntry_t *local_100;
  ulong local_f0;
  
  maxDist = 1 << ((byte)params->windowLog & 0x1f);
  if ((ldmState->window).nextSrc < (byte *)((long)src + srcSize)) {
    __assert_fail("ldmState->window.nextSrc >= (BYTE const*)src + srcSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x44ee,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  uVar13 = sequences->size;
  if (uVar13 < sequences->pos) {
    __assert_fail("sequences->pos <= sequences->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x44f2,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  if (sequences->capacity < uVar13) {
    __assert_fail("sequences->size <= sequences->capacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x44f3,
                  "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                 );
  }
  local_148 = 0;
  lVar21 = 0;
  do {
    if ((lVar21 == ((srcSize >> 0x14) + 1) - (ulong)((srcSize & 0xfffff) == 0)) ||
       (sequences->capacity <= uVar13)) {
      return 0;
    }
    src_00 = (byte *)((long)src + lVar21 * 0x100000);
    pbVar24 = src_00 + 0x100000;
    if (srcSize + lVar21 * -0x100000 < 0x100000) {
      pbVar24 = (byte *)((long)src + srcSize);
    }
    if ((long)srcSize <= lVar21 * 0x100000) {
      __assert_fail("chunkStart < iend",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x44fd,
                    "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                   );
    }
    local_180 = (ldmState->window).base;
    uVar9 = (int)pbVar24 - (int)local_180;
    if (0xe0000000 < uVar9) {
      UVar8 = params->hashLog;
      UVar10 = ZSTD_window_correctOverflow(&ldmState->window,0,maxDist,src_00);
      plVar3 = ldmState->hashTable;
      for (lVar20 = 0; 1L << ((byte)UVar8 & 0x3f) != lVar20; lVar20 = lVar20 + 1) {
        uVar9 = plVar3[lVar20].offset;
        UVar22 = uVar9 - UVar10;
        if (uVar9 < UVar10) {
          UVar22 = 0;
        }
        plVar3[lVar20].offset = UVar22;
      }
      local_180 = (ldmState->window).base;
      uVar9 = (int)pbVar24 - (int)local_180;
    }
    local_1a0 = (ldmState->window).lowLimit;
    if (ldmState->loadedDictEnd + maxDist < uVar9) {
      uVar9 = uVar9 - maxDist;
      if (local_1a0 < uVar9) {
        (ldmState->window).lowLimit = uVar9;
        local_1a0 = uVar9;
      }
      uVar9 = (ldmState->window).dictLimit;
      if (uVar9 < local_1a0) {
        (ldmState->window).dictLimit = local_1a0;
        uVar9 = local_1a0;
      }
      ldmState->loadedDictEnd = 0;
    }
    else {
      uVar9 = (ldmState->window).dictLimit;
    }
    UVar8 = params->bucketSizeLog;
    UVar10 = params->hashRateLog;
    uVar17 = (ulong)params->minMatchLength;
    UVar4 = ldmState->hashPower;
    if (local_1a0 < uVar9) {
      pBVar25 = (ldmState->window).dictBase;
      uVar23 = local_1a0;
    }
    else {
      pBVar25 = (BYTE *)0x0;
      uVar23 = uVar9;
    }
    UVar22 = params->hashLog - UVar8;
    pBase_00 = local_180 + uVar9;
    pInLimit = src_00 + ((long)pbVar24 - (long)src_00);
    uVar6 = 8;
    if (8 < params->minMatchLength) {
      uVar6 = uVar17;
    }
    local_198 = 0;
    pbVar14 = (byte *)0x0;
    pbVar18 = src_00;
    iend = src_00;
    while (lastHashed = pbVar18, lastHashed <= pInLimit + -uVar6) {
      if (lastHashed == src_00) {
        local_198 = ZSTD_rollingHash_compute(src_00,uVar17);
      }
      else {
        local_198 = (local_198 - ((ulong)*pbVar14 + 10) * UVar4) * -0x30e44323485a9b9d +
                    (ulong)pbVar14[uVar17] + 10;
      }
      UVar11 = ZSTD_ldm_getTag(local_198,UVar22,UVar10);
      pbVar14 = lastHashed;
      if ((UVar11 ^ -1 << ((byte)UVar10 & 0x1f)) == 0xffffffff) {
        UVar11 = (int)lastHashed - (int)local_180;
        UVar12 = ZSTD_ldm_getSmallHash(local_198,UVar22);
        plVar27 = ldmState->hashTable + ((ulong)UVar12 << ((byte)params->bucketSizeLog & 0x3f));
        UVar12 = ZSTD_ldm_getChecksum(local_198,UVar22);
        plVar3 = plVar27 + (1L << ((byte)UVar8 & 0x3f));
        local_f0 = 0;
        local_100 = (ldmEntry_t *)0x0;
        local_108 = 0;
        sVar26 = 0;
        for (; plVar27 < plVar3; plVar27 = plVar27 + 1) {
          if (plVar27->checksum == UVar12) {
            uVar2 = plVar27->offset;
            if (uVar23 < uVar2) {
              if (local_1a0 < uVar9) {
                pbVar18 = pInLimit;
                pBVar7 = local_180;
                if (uVar2 < uVar9) {
                  pbVar18 = pBVar25 + uVar9;
                  pBVar7 = pBVar25;
                }
                sVar15 = ZSTD_count_2segments(lastHashed,pBVar7 + uVar2,pInLimit,pbVar18,pBase_00);
                if (uVar17 <= sVar15) {
                  pBase = pBase_00;
                  if (uVar2 < uVar9) {
                    pBase = pBVar25 + uVar23;
                  }
                  sVar16 = ZSTD_ldm_countBackwardsMatch(lastHashed,iend,pBVar7 + uVar2,pBase);
                  uVar19 = sVar16 + sVar15;
LAB_0014666f:
                  if (local_f0 < uVar19) {
                    sVar26 = sVar15;
                    local_108 = sVar16;
                    local_100 = plVar27;
                    local_f0 = uVar19;
                  }
                }
              }
              else {
                sVar15 = ZSTD_count(lastHashed,local_180 + uVar2,pInLimit);
                if (uVar17 <= sVar15) {
                  sVar16 = ZSTD_ldm_countBackwardsMatch(lastHashed,iend,local_180 + uVar2,pBase_00);
                  uVar19 = sVar16 + sVar15;
                  goto LAB_0014666f;
                }
              }
            }
          }
        }
        if (local_100 == (ldmEntry_t *)0x0) {
          ZSTD_ldm_makeEntryAndInsertByTag(ldmState,local_198,UVar22,UVar11,*params);
          goto LAB_0014672d;
        }
        sVar15 = sequences->size;
        if (sVar15 == sequences->capacity) {
          return 0xffffffffffffffba;
        }
        prVar5 = sequences->seq;
        UVar12 = local_100->offset;
        local_150 = (int)iend;
        prVar5[sVar15].litLength = ((int)lastHashed - (int)local_108) - local_150;
        prVar5[sVar15].matchLength = (int)local_108 + (int)sVar26;
        prVar5[sVar15].offset = UVar11 - UVar12;
        sequences->size = sVar15 + 1;
        ZSTD_ldm_makeEntryAndInsertByTag(ldmState,local_198,UVar22,UVar11,*params);
        iend = lastHashed + sVar26;
        pbVar18 = iend;
        if (iend <= pInLimit + -uVar6) {
          local_198 = ZSTD_ldm_fillLdmHashTable
                                (ldmState,local_198,lastHashed,iend,local_180,UVar22,*params);
          pbVar14 = iend + -1;
        }
      }
      else {
LAB_0014672d:
        pbVar18 = lastHashed + 1;
      }
    }
    uVar17 = (long)pbVar24 - (long)iend;
    if (0xffffffffffffff88 < uVar17) {
      return uVar17;
    }
    uVar6 = sequences->size;
    if (uVar13 < uVar6) {
      pUVar1 = &sequences->seq[uVar13].litLength;
      *pUVar1 = *pUVar1 + (int)local_148;
    }
    else {
      if (src_00 != iend) {
        __assert_fail("newLeftoverSize == chunkSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x451c,
                      "size_t ZSTD_ldm_generateSequences(ldmState_t *, rawSeqStore_t *, const ldmParams_t *, const void *, size_t)"
                     );
      }
      uVar17 = ((long)pbVar24 - (long)src_00) + local_148;
    }
    lVar21 = lVar21 + 1;
    uVar13 = uVar6;
    local_148 = uVar17;
  } while( true );
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, chunkStart);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         the offset against maxDist directly.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, &ldmState->loadedDictEnd, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}